

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bios.c
# Opt level: O0

int parse_pcir(envy_bios *bios)

{
  int iVar1;
  envy_bios_part *peVar2;
  uint32_t local_48;
  ushort local_44;
  byte local_42;
  char local_41;
  uint32_t efi_sig;
  uint16_t init_ilen_1;
  uint8_t init_ilen;
  uint8_t sum;
  int i;
  uint16_t pcir_ilen_1;
  uint16_t pcir_offset_1;
  uint16_t efi_offset_1;
  uint16_t pcir_res;
  uint8_t pcir_indi;
  uint8_t pcir_rev;
  uint16_t pcir_ilen;
  uint32_t pcir_sig;
  int iStack_24;
  uint16_t sig;
  uint16_t pcir_offset;
  uint16_t efi_offset;
  int next;
  uint num;
  uint curpos;
  envy_bios *bios_local;
  
  bios->length = bios->origlength;
  next = 0;
  _pcir_offset = 0;
  _num = bios;
  do {
    iStack_24 = 0;
    iVar1 = bios_u16(_num,next,&pcir_ilen);
    if (((((iVar1 != 0) || (pcir_ilen != 0xaa55)) ||
         (iVar1 = bios_u16(_num,next + 0x16,(uint16_t *)((long)&pcir_sig + 2)), iVar1 != 0)) ||
        ((((iVar1 = bios_u16(_num,next + 0x18,(uint16_t *)&pcir_sig), iVar1 != 0 ||
           (iVar1 = bios_u32(_num,next + (uint)(ushort)pcir_sig,(uint32_t *)&efi_offset_1),
           iVar1 != 0)) ||
          ((_efi_offset_1 != 0x52494350 ||
           ((iVar1 = bios_u8(_num,next + (uint)(ushort)pcir_sig + 0xc,
                             (uint8_t *)((long)&pcir_ilen_1 + 1)), iVar1 != 0 ||
            (iVar1 = bios_u16(_num,next + (uint)(ushort)pcir_sig + 0x10,&pcir_offset_1), iVar1 != 0)
            ))))) ||
         (iVar1 = bios_u8(_num,next + (uint)(ushort)pcir_sig + 0x15,(uint8_t *)&pcir_ilen_1),
         iVar1 != 0)))) ||
       (((iVar1 = bios_u16(_num,next + (uint)(ushort)pcir_sig + 0x16,(uint16_t *)((long)&i + 2)),
         iVar1 != 0 || (_num->origlength < next + (uint)pcir_offset_1 * 0x200)) ||
        (((ushort)pcir_sig & 3) != 0)))) {
      _num->broken_part = 1;
      break;
    }
    envy_bios_block(_num,next,2,"SIG",_pcir_offset);
    envy_bios_block(_num,next + 0x18,2,"PCIR_PTR",_pcir_offset);
    if (pcir_ilen_1._1_1_ == '\0') {
      envy_bios_block(_num,next + (uint)(ushort)pcir_sig,0x18,"PCIR",_pcir_offset);
    }
    else {
      envy_bios_block(_num,next + (uint)(ushort)pcir_sig,0x1c,"PCIR",_pcir_offset);
    }
    if (((byte)pcir_ilen_1 & 0x80) == 0) {
      iStack_24 = 1;
    }
    next = (uint)pcir_offset_1 * 0x200 + next;
    _pcir_offset = _pcir_offset + 1;
  } while (iStack_24 != 0);
  if (_pcir_offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    _num->partsnum = _pcir_offset;
    peVar2 = (envy_bios_part *)calloc((long)_num->partsnum,0x38);
    _num->parts = peVar2;
    if (_num->parts == (envy_bios_part *)0x0) {
      bios_local._4_4_ = -0xc;
    }
    else {
      _num->length = next;
      next = 0;
      for (_pcir_offset = 0; _pcir_offset < (uint)_num->partsnum; _pcir_offset = _pcir_offset + 1) {
        _num->parts[_pcir_offset].start = next;
        bios_u16(_num,next + 0x16,(uint16_t *)&i);
        bios_u16(_num,next + 0x18,(uint16_t *)&init_ilen);
        bios_u16(_num,next + (uint)_init_ilen + 4,&_num->parts[_pcir_offset].pcir_vendor);
        bios_u16(_num,next + (uint)_init_ilen + 6,&_num->parts[_pcir_offset].pcir_device);
        if (_num->parts[_pcir_offset].pcir_code_rev == 0) {
          bios_u16(_num,next + (uint)_init_ilen + 8,&_num->parts[_pcir_offset].pcir_vpd);
        }
        if (2 < _num->parts[_pcir_offset].pcir_code_rev) {
          bios_u16(_num,next + (uint)_init_ilen + 8,
                   &_num->parts[_pcir_offset].pcir_device_list_offset);
        }
        bios_u16(_num,next + (uint)_init_ilen + 10,&_num->parts[_pcir_offset].pcir_len);
        bios_u8(_num,next + (uint)_init_ilen + 0xc,&_num->parts[_pcir_offset].pcir_rev);
        bios_u8(_num,next + (uint)_init_ilen + 0xd,_num->parts[_pcir_offset].pcir_class);
        bios_u8(_num,next + (uint)_init_ilen + 0xe,_num->parts[_pcir_offset].pcir_class + 1);
        bios_u8(_num,next + (uint)_init_ilen + 0xf,_num->parts[_pcir_offset].pcir_class + 2);
        bios_u16(_num,next + (uint)_init_ilen + 0x10,&init_ilen_1);
        bios_u16(_num,next + (uint)_init_ilen + 0x12,&_num->parts[_pcir_offset].pcir_code_rev);
        bios_u8(_num,next + (uint)_init_ilen + 0x14,&_num->parts[_pcir_offset].pcir_code_type);
        bios_u8(_num,next + (uint)_init_ilen + 0x15,&_num->parts[_pcir_offset].pcir_indi);
        if (2 < _num->parts[_pcir_offset].pcir_code_rev) {
          bios_u16(_num,next + (uint)_init_ilen + 0x16,&_num->parts[_pcir_offset].pcir_mrtil);
          bios_u16(_num,next + (uint)_init_ilen + 0x18,
                   &_num->parts[_pcir_offset].pcir_config_util_offset);
          bios_u16(_num,next + (uint)_init_ilen + 0x1a,
                   &_num->parts[_pcir_offset].pcir_dmtf_clp_offset);
        }
        _num->parts[_pcir_offset].efi_offset = (uint)(ushort)i;
        _num->parts[_pcir_offset].pcir_offset = (uint)_init_ilen;
        _num->parts[_pcir_offset].length = (uint)init_ilen_1 << 9;
        if (_num->parts[_pcir_offset].pcir_code_type == '\0') {
          local_41 = '\0';
          bios_u8(_num,next + 2,&local_42);
          _num->parts[_pcir_offset].init_length = (uint)local_42 << 9;
          envy_bios_block(_num,next + 2,1,"SIG_LENGTH",_pcir_offset);
          envy_bios_block(_num,next + 3,3,"SIG_X86_INIT_PTR",_pcir_offset);
          envy_bios_block(_num,next + 6,0x12,"RESERVED",_pcir_offset);
          for (efi_sig = 0; efi_sig < _num->parts[_pcir_offset].init_length; efi_sig = efi_sig + 1)
          {
            local_41 = local_41 + _num->data[next + efi_sig];
          }
          _num->parts[_pcir_offset].chksum_pass = (uint)(local_41 == '\0');
        }
        else if (_num->parts[_pcir_offset].pcir_code_type == '\x03') {
          bios_u16(_num,next + 2,&local_44);
          _num->parts[_pcir_offset].init_length = (uint)local_44 << 9;
          envy_bios_block(_num,next + 2,2,"SIG_LENGTH",_pcir_offset);
          bios_u32(_num,next + 4,&local_48);
          _num->parts[_pcir_offset].chksum_pass = (uint)(local_48 == 0xef1);
          bios_u16(_num,next + 8,&_num->parts[_pcir_offset].efi_subsystem_type);
          bios_u16(_num,next + 10,&_num->parts[_pcir_offset].efi_machine_type);
          bios_u16(_num,next + 0xc,&_num->parts[_pcir_offset].efi_compression_type);
          envy_bios_block(_num,next + 4,10,"SIG_EFI",_pcir_offset);
          envy_bios_block(_num,next + 0xe,8,"RESERVED",_pcir_offset);
          envy_bios_block(_num,next + 0x16,2,"EFI_PTR",_pcir_offset);
        }
        next = _num->parts[_pcir_offset].length + next;
      }
      bios_local._4_4_ = 0;
    }
  }
  return bios_local._4_4_;
}

Assistant:

static int parse_pcir (struct envy_bios *bios) {
	bios->length = bios->origlength;
	unsigned int curpos = 0;
	unsigned int num = 0;
	int next = 0;
	do {
		uint16_t efi_offset;
		uint16_t pcir_offset;
		uint16_t sig;
		uint32_t pcir_sig;
		uint16_t pcir_ilen;
		uint8_t pcir_rev;
		uint8_t pcir_indi;
		uint16_t pcir_res;
		next = 0;
		if (bios_u16(bios, curpos, &sig)) {
broken_part:
			bios->broken_part = 1;
			break;
		}
		if (sig != 0xaa55)
			goto broken_part;
		if (bios_u16(bios, curpos + 0x16, &efi_offset))
			goto broken_part;
		if (bios_u16(bios, curpos + 0x18, &pcir_offset))
			goto broken_part;
		if (bios_u32(bios, curpos+pcir_offset, &pcir_sig))
			goto broken_part;
		if (pcir_sig != 0x52494350)
			goto broken_part;
		if (bios_u8(bios,curpos+pcir_offset+0x0C, &pcir_rev))
			goto broken_part;
		if (bios_u16(bios, curpos+pcir_offset+0x10, &pcir_ilen))
			goto broken_part;
		if (bios_u8(bios, curpos+pcir_offset+0x15, &pcir_indi))
			goto broken_part;
		if (bios_u16(bios, curpos+pcir_offset+0x16, &pcir_res))
			goto broken_part;
		if (curpos + pcir_ilen * 0x200 > bios->origlength)
			goto broken_part;
		/* "The PCI Data Structure ... must be DWORD aligned."
		 *  PCI Specification, Revision 2.2. (1998), pg 207
		 *  PCI Firmware Specification, Revision 3.0 (2005), pg 71
		 */
		if (pcir_offset & 0x3)
			goto broken_part;
		envy_bios_block(bios, curpos, 2, "SIG", num);
		envy_bios_block(bios, curpos+0x18, 2, "PCIR_PTR", num);
		switch (pcir_rev) {
			case ENVY_BIOS_PCIR_REV_2DOT2:
				envy_bios_block(bios, curpos+pcir_offset, 0x18, "PCIR", num);
				break;
			case ENVY_BIOS_PCIR_REV_3DOT0:
			default:
				envy_bios_block(bios, curpos+pcir_offset, 0x1C, "PCIR", num);
				break;
		}
		if (!(pcir_indi & 0x80))
			next = 1;
		curpos += pcir_ilen * 0x200;
		num++;
	} while(next);
	if (!num)
		return -EINVAL;
	bios->partsnum = num;
	bios->parts = calloc(bios->partsnum, sizeof *bios->parts);
	if (!bios->parts)
		return -ENOMEM;
	bios->length = curpos;
	curpos = 0;
	for (num = 0; num < bios->partsnum; num++) {
		uint16_t efi_offset;
		uint16_t pcir_offset;
		uint16_t pcir_ilen;
		bios->parts[num].start = curpos;
		bios_u16(bios, curpos + 0x16, &efi_offset);
		bios_u16(bios, curpos + 0x18, &pcir_offset);
		bios_u16(bios, curpos+pcir_offset+4, &bios->parts[num].pcir_vendor);
		bios_u16(bios, curpos+pcir_offset+6, &bios->parts[num].pcir_device);
		if (bios->parts[num].pcir_code_rev == ENVY_BIOS_PCIR_REV_2DOT2)
			bios_u16(bios, curpos+pcir_offset+0x8, &bios->parts[num].pcir_vpd);
		if (bios->parts[num].pcir_code_rev >= ENVY_BIOS_PCIR_REV_3DOT0)
			bios_u16(bios, curpos+pcir_offset+0x8, &bios->parts[num].pcir_device_list_offset);
		bios_u16(bios, curpos+pcir_offset+0xa, &bios->parts[num].pcir_len);
		bios_u8(bios, curpos+pcir_offset+0xc, &bios->parts[num].pcir_rev);
		bios_u8(bios, curpos+pcir_offset+0xd, &bios->parts[num].pcir_class[0]);
		bios_u8(bios, curpos+pcir_offset+0xe, &bios->parts[num].pcir_class[1]);
		bios_u8(bios, curpos+pcir_offset+0xf, &bios->parts[num].pcir_class[2]);
		bios_u16(bios, curpos+pcir_offset+0x10, &pcir_ilen);
		bios_u16(bios, curpos+pcir_offset+0x12, &bios->parts[num].pcir_code_rev);
		bios_u8(bios, curpos+pcir_offset+0x14, &bios->parts[num].pcir_code_type);
		bios_u8(bios, curpos+pcir_offset+0x15, &bios->parts[num].pcir_indi);
		if (bios->parts[num].pcir_code_rev >= ENVY_BIOS_PCIR_REV_3DOT0) {
			bios_u16(bios, curpos+pcir_offset+0x16, &bios->parts[num].pcir_mrtil);
			bios_u16(bios, curpos+pcir_offset+0x18, &bios->parts[num].pcir_config_util_offset);
			bios_u16(bios, curpos+pcir_offset+0x1a, &bios->parts[num].pcir_dmtf_clp_offset);
		}
		bios->parts[num].efi_offset = efi_offset;
		bios->parts[num].pcir_offset = pcir_offset;
		bios->parts[num].length = pcir_ilen * 0x200;
		if (bios->parts[num].pcir_code_type == ENVY_BIOS_PCIR_INTEL_X86) {
			int i;
			uint8_t sum = 0;
			uint8_t init_ilen;
			bios_u8(bios, curpos + 2, &init_ilen);
			bios->parts[num].init_length = init_ilen * 0x200;
			envy_bios_block(bios, curpos + 2, 1, "SIG_LENGTH", num);
			envy_bios_block(bios, curpos + 3, 3, "SIG_X86_INIT_PTR", num);
			envy_bios_block(bios, curpos + 6, 18, "RESERVED", num);
			for (i = 0; i < bios->parts[num].init_length; i++)
				sum += bios->data[curpos + i];
			bios->parts[num].chksum_pass = (sum == 0);
		} else if (bios->parts[num].pcir_code_type == ENVY_BIOS_PCIR_EFI) {
			uint16_t init_ilen;
			uint32_t efi_sig;
			bios_u16(bios, curpos + 2, &init_ilen);
			bios->parts[num].init_length = init_ilen * 0x200;
			envy_bios_block(bios, curpos + 2, 2, "SIG_LENGTH", num);
			bios_u32(bios, curpos + 4, &efi_sig);
			bios->parts[num].chksum_pass = (efi_sig == 0x000ef1);
			bios_u16(bios, curpos + 0x8, &bios->parts[num].efi_subsystem_type);
			bios_u16(bios, curpos + 0xa, &bios->parts[num].efi_machine_type);
			bios_u16(bios, curpos + 0xc, &bios->parts[num].efi_compression_type);
			envy_bios_block(bios, curpos + 0x4, 10, "SIG_EFI", num);
			envy_bios_block(bios, curpos + 0xe, 8, "RESERVED", num);
			envy_bios_block(bios, curpos + 0x16, 2, "EFI_PTR", num);
		}
		curpos += bios->parts[num].length;
	}
	return 0;
}